

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

bool __thiscall ExecutorRegVm::Run(ExecutorRegVm *this,uint functionID,char *arguments)

{
  char *pcVar1;
  RegVmRegister *pRVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  RegVmCmd *pRVar6;
  size_t sVar7;
  ExternFuncInfo *pEVar8;
  ExternTypeInfo *pEVar9;
  ExternMemberInfo *pEVar10;
  uint local_cc;
  ExternTypeInfo *targetType;
  ExternFuncInfo *target_1;
  uint address;
  uint currentFrame;
  char *currPos;
  RegVmReturnType resultType;
  RegVmRegister *prevRegFileLastTop;
  uint local_84;
  RegVmCmd *pRStack_80;
  uint stackSize;
  uint local_74;
  uint local_70;
  uint alignOffset;
  uint argumentsSize;
  uint funcPos;
  ExternFuncInfo *target;
  uint *tempStackPtr;
  RegVmRegister *regFileTop;
  RegVmRegister *regFilePtr;
  uint local_40;
  uint prevDataSize;
  uint prevLastFinalReturn;
  bool errorState;
  RegVmCmd *instruction;
  char *pcStack_28;
  RegVmReturnType retType;
  char *arguments_local;
  ExecutorRegVm *pEStack_18;
  uint functionID_local;
  ExecutorRegVm *this_local;
  
  pcStack_28 = arguments;
  arguments_local._4_4_ = functionID;
  pEStack_18 = this;
  bVar3 = FastVector<RegVmCmd,_false,_false>::empty(&this->exLinker->exRegVmCode);
  if (bVar3) {
    Stop(this,"ERROR: module contains no code");
    this_local._7_1_ = false;
  }
  else {
    if (((this->codeRunning & 1U) == 0) || (arguments_local._4_4_ == 0xffffffff)) {
      InitExecution(this);
    }
    this->codeRunning = true;
    instruction._4_4_ = rvrVoid;
    pRVar6 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,0);
    this->codeBase = pRVar6;
    _prevLastFinalReturn =
         FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,0);
    prevDataSize._3_1_ = 0;
    local_40 = this->lastFinalReturn;
    uVar4 = FastVector<RegVmCmd_*,_false,_false>::size(&this->callStack);
    this->lastFinalReturn = uVar4;
    regFilePtr._4_4_ = FastVector<char,_true,_true>::size(&this->dataStack);
    regFileTop = this->regFileLastTop;
    tempStackPtr = (uint *)(regFileTop + 0x100);
    target = (ExternFuncInfo *)this->tempStackArrayBase;
    if (arguments_local._4_4_ == 0xffffffff) {
      uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
      if (uVar4 < this->exLinker->globalVarSize) {
        __assert_fail("dataStack.size() >= exLinker->globalVarSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x115,"bool ExecutorRegVm::Run(unsigned int, const char *)");
      }
      memset((this->dataStack).data,0,(ulong)this->exLinker->globalVarSize);
      regFileTop->field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
      regFileTop[1].field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
      regFileTop[2].field_0 =
           (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
      regFileTop[3].field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)regFileTop;
      memset(regFileTop + 4,0,(((long)tempStackPtr - (long)regFileTop >> 3) + -4) * 8);
    }
    else {
      _argumentsSize =
           FastVector<ExternFuncInfo,_false,_false>::operator[]
                     (this->exFunctions,arguments_local._4_4_);
      alignOffset = _argumentsSize->regVmAddress;
      instruction._4_4_ =
           GetFunctionVmReturnType
                     (_argumentsSize,this->exTypes->data,(this->exLinker->exTypeExtra).data);
      if (alignOffset == 0xffffffff) {
        memcpy(target,pcStack_28,(ulong)_argumentsSize->argumentSize);
        if (_argumentsSize->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
          bVar3 = RunExternalFunction(this,arguments_local._4_4_,&target->offsetToName);
          if (!bVar3) {
            prevDataSize._3_1_ = 1;
          }
        }
        else {
          (*_argumentsSize->funcPtrWrap)
                    (_argumentsSize->funcPtrWrapTarget,(char *)target,(char *)target);
          if ((this->callContinue & 1U) == 0) {
            prevDataSize._3_1_ = 1;
          }
        }
        _prevLastFinalReturn = (RegVmCmd *)0x0;
      }
      else {
        _prevLastFinalReturn =
             FastVector<RegVmCmd,_false,_false>::operator[]
                       (&this->exLinker->exRegVmCode,alignOffset);
        local_70 = _argumentsSize->argumentSize;
        uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
        if ((uVar4 & 0xf) == 0) {
          local_cc = 0;
        }
        else {
          uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
          local_cc = 0x10 - (uVar4 & 0xf);
        }
        local_74 = local_cc;
        uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
        if (uVar4 + local_74 + local_70 < (this->dataStack).max) {
          pcVar1 = (this->dataStack).data;
          uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
          memcpy(pcVar1 + (ulong)local_74 + (ulong)uVar4,pcStack_28,(ulong)local_70);
          local_84 = _argumentsSize->stackSize + 0xf & 0xfffffff0;
          regFileTop = this->regFileLastTop;
          tempStackPtr = (uint *)(regFileTop + _argumentsSize->regVmRegisters);
          uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
          if ((uVar4 & 0xf) != 0) {
            __assert_fail("dataStack.size() % 16 == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0xf6,"bool ExecutorRegVm::Run(unsigned int, const char *)");
          }
          uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
          if (uVar4 + local_84 < (this->dataStack).max) {
            uVar4 = FastVector<char,_true,_true>::size(&this->dataStack);
            FastVector<char,_true,_true>::resize(&this->dataStack,uVar4 + local_84);
            if (local_84 < local_70) {
              __assert_fail("argumentsSize <= stackSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                            ,0x103,"bool ExecutorRegVm::Run(unsigned int, const char *)");
            }
            if (local_84 != local_70) {
              memset((this->dataStack).data + (ulong)local_70 + (ulong)regFilePtr._4_4_,0,
                     (ulong)(local_84 - local_70));
            }
            regFileTop->field_0 =
                 (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
            regFileTop[1].field_0 =
                 (anon_union_8_3_3250f155_for_RegVmRegister_0)
                 ((long)(this->dataStack).data + (ulong)regFilePtr._4_4_);
            regFileTop[2].field_0 =
                 (anon_union_8_3_3250f155_for_RegVmRegister_0)
                 (this->exLinker->exRegVmConstants).data;
            regFileTop[3].field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)regFileTop;
          }
          else {
            prevRegFileLastTop = (RegVmRegister *)(_prevLastFinalReturn + 1);
            FastVector<RegVmCmd_*,_false,_false>::push_back
                      (&this->callStack,(RegVmCmd **)&prevRegFileLastTop);
            _prevLastFinalReturn = (RegVmCmd *)0x0;
            Stop(this,"ERROR: stack overflow");
            instruction._4_4_ = rvrError;
          }
          memset(regFileTop + 4,0,(((long)tempStackPtr - (long)regFileTop >> 3) + -4) * 8);
        }
        else {
          pRStack_80 = _prevLastFinalReturn + 1;
          FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,&stack0xffffffffffffff80)
          ;
          _prevLastFinalReturn = (RegVmCmd *)0x0;
          Stop(this,"ERROR: stack overflow");
          instruction._4_4_ = rvrError;
        }
      }
    }
    pRVar2 = this->regFileLastTop;
    this->regFileLastTop = (RegVmRegister *)tempStackPtr;
    currPos._4_4_ = instruction._4_4_;
    if (_prevLastFinalReturn != (RegVmCmd *)0x0) {
      currPos._4_4_ = RunCode(_prevLastFinalReturn,regFileTop,this,this->codeBase);
    }
    this->regFileLastTop = pRVar2;
    FastVector<char,_true,_true>::shrink(&this->dataStack,regFilePtr._4_4_);
    if (currPos._4_4_ == rvrError) {
      prevDataSize._3_1_ = 1;
    }
    else if (instruction._4_4_ == rvrVoid) {
      instruction._4_4_ = currPos._4_4_;
    }
    else if (instruction._4_4_ != currPos._4_4_) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x136,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    if ((prevDataSize._3_1_ & 1) == 0) {
      this->lastFinalReturn = local_40;
      if (arguments_local._4_4_ == 0xffffffff) {
        this->tempStackType = 0;
        if (instruction._4_4_ == rvrDouble) {
          this->tempStackType = 7;
        }
        else if (instruction._4_4_ == rvrLong) {
          this->tempStackType = 5;
        }
        else if (instruction._4_4_ == rvrInt) {
          this->tempStackType = 4;
        }
      }
      else {
        pEVar8 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                           (this->exFunctions,arguments_local._4_4_);
        pEVar9 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           (this->exTypes,pEVar8->funcType);
        pEVar10 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                            (&this->exLinker->exTypeExtra,(pEVar9->field_11).subType);
        this->tempStackType = pEVar10->type;
      }
      this_local._7_1_ = true;
    }
    else {
      if (this->lastFinalReturn == 0) {
        _address = this->execErrorBuffer;
        sVar7 = strlen(this->execErrorBuffer);
        _address = _address + sVar7;
        iVar5 = NULLC::SafeSprintf(_address,(long)(0x10000 -
                                                  ((int)_address - (int)this->execErrorBuffer)),
                                   "\r\nCall stack:\r\n");
        _address = _address + iVar5;
        target_1._4_4_ = 0;
        while( true ) {
          uVar4 = GetCallStackAddress(this,target_1._4_4_);
          if (uVar4 == 0) break;
          uVar4 = PrintStackFrame(uVar4,_address,
                                  0x10000 - ((int)_address - (int)this->execErrorBuffer),false);
          _address = _address + uVar4;
          target_1._4_4_ = target_1._4_4_ + 1;
        }
      }
      this->execErrorFinalReturnDepth = this->lastFinalReturn;
      this->lastFinalReturn = local_40;
      this->callContinue = false;
      this->codeRunning = false;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorRegVm::Run(unsigned functionID, const char *arguments)
{
	if(exLinker->exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	if(!codeRunning || functionID == ~0u)
		InitExecution();

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	codeBase = &exLinker->exRegVmCode[0];
	RegVmCmd *instruction = &exLinker->exRegVmCode[0];

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = callStack.size();

	unsigned prevDataSize = dataStack.size();

	RegVmRegister *regFilePtr = regFileLastTop;
	RegVmRegister *regFileTop = regFilePtr + 256;

	unsigned *tempStackPtr = tempStackArrayBase;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Copy all arguments
			memcpy(tempStackPtr, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

				if(!callContinue)
					errorState = true;
			}
			else
			{
				if(!RunExternalFunction(functionID, tempStackPtr))
					errorState = true;
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instruction = NULL;
		}
		else
		{
			instruction = &exLinker->exRegVmCode[funcPos];

			unsigned argumentsSize = target.argumentSize;

			// Keep stack frames aligned to 16 byte boundary
			unsigned alignOffset = (dataStack.size() % 16 != 0) ? (16 - (dataStack.size() % 16)) : 0;

			if(dataStack.size() + alignOffset + argumentsSize >= dataStack.max)
			{
				callStack.push_back(instruction + 1);
				instruction = NULL;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				memcpy((char*)(dataStack.data + dataStack.size() + alignOffset), arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				regFilePtr = regFileLastTop;
				regFileTop = regFilePtr + target.regVmRegisters;

				assert(dataStack.size() % 16 == 0);

				if(dataStack.size() + stackSize >= dataStack.max)
				{
					callStack.push_back(instruction + 1);
					instruction = NULL;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					dataStack.resize(dataStack.size() + stackSize);

					assert(argumentsSize <= stackSize);

					if(stackSize - argumentsSize)
						memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}

				memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(dataStack.size() >= exLinker->globalVarSize);
		memset(dataStack.data, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFileLastTop = regFileLastTop;

	regFileLastTop = regFileTop;

	RegVmReturnType resultType = retType;

	if(instruction)
		resultType = RunCode(instruction, regFilePtr, this, codeBase);

	regFileLastTop = prevRegFileLastTop;

	dataStack.shrink(prevDataSize);

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}